

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::getSubElement(Value *__return_storage_ptr__,Value *this,SubElementPath *path)

{
  uint8_t *puVar1;
  Type local_58;
  undefined1 local_40 [8];
  TypeAndOffset typeAndOffset;
  SubElementPath *path_local;
  Value *this_local;
  
  typeAndOffset.offset = (size_t)path;
  SubElementPath::getElement((TypeAndOffset *)local_40,path,&this->type);
  Type::Type(&local_58,(Type *)local_40);
  puVar1 = LazyAllocatedData::data(&this->allocatedData);
  Value(__return_storage_ptr__,&local_58,puVar1 + (long)typeAndOffset.type.structure.object);
  Type::~Type(&local_58);
  SubElementPath::TypeAndOffset::~TypeAndOffset((TypeAndOffset *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Value Value::getSubElement (const SubElementPath& path) const
{
    auto typeAndOffset = path.getElement (type);
    return Value (std::move (typeAndOffset.type), allocatedData.data() + typeAndOffset.offset);
}